

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere.cpp
# Opt level: O3

Interaction * __thiscall
phyr::Sphere::sample(Interaction *__return_storage_ptr__,Sphere *this,Point2f *u,double *pdf)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  Transform *pTVar8;
  undefined1 auVar9 [16];
  double dVar10;
  ulong uVar11;
  uint uVar12;
  double dVar13;
  double dVar14;
  double extraout_XMM0_Qa;
  double dVar17;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  Vector3f local_38;
  
  dVar21 = this->radius;
  uniformSampleSphere(&local_38,u);
  dVar13 = local_38.x * dVar21 + 0.0;
  dVar18 = local_38.y * dVar21 + 0.0;
  dVar29 = dVar21 * local_38.z + 0.0;
  (__return_storage_ptr__->wo).x = 0.0;
  (__return_storage_ptr__->wo).y = 0.0;
  (__return_storage_ptr__->wo).z = 0.0;
  pTVar8 = (this->super_Shape).localToWorld;
  dVar21 = (pTVar8->invMat).d[2][2] * dVar29 +
           (pTVar8->invMat).d[0][2] * dVar13 + (pTVar8->invMat).d[1][2] * dVar18;
  dVar26 = dVar29 * (pTVar8->invMat).d[2][0] +
           dVar13 * (pTVar8->invMat).d[0][0] + (pTVar8->invMat).d[1][0] * dVar18;
  dVar28 = dVar29 * (pTVar8->invMat).d[2][1] +
           dVar13 * (pTVar8->invMat).d[0][1] + (pTVar8->invMat).d[1][1] * dVar18;
  dVar25 = 1.0 / SQRT(dVar21 * dVar21 + dVar26 * dVar26 + dVar28 * dVar28);
  (__return_storage_ptr__->n).x = dVar25 * dVar26;
  (__return_storage_ptr__->n).y = dVar25 * dVar28;
  (__return_storage_ptr__->n).z = dVar21 * dVar25;
  if ((this->super_Shape).reverseNormals == true) {
    (__return_storage_ptr__->n).x = -(dVar25 * dVar26);
    (__return_storage_ptr__->n).y = -(dVar25 * dVar28);
    (__return_storage_ptr__->n).z = -(dVar21 * dVar25);
  }
  dVar22 = this->radius / SQRT(dVar29 * dVar29 + dVar13 * dVar13 + dVar18 * dVar18);
  dVar13 = dVar13 * dVar22;
  dVar18 = dVar18 * dVar22;
  dVar22 = dVar22 * dVar29;
  dVar10 = ABS(dVar13) * 5.551115123125786e-16;
  dVar31 = ABS(dVar18) * 5.551115123125786e-16;
  dVar27 = ABS(dVar22) * 5.551115123125786e-16;
  dVar21 = (pTVar8->mat).d[2][0];
  dVar25 = (pTVar8->mat).d[2][1];
  dVar32 = dVar18 * dVar25;
  dVar33 = dVar21 * dVar13;
  dVar26 = (pTVar8->mat).d[2][2];
  dVar34 = dVar26 * dVar22;
  dVar28 = (pTVar8->mat).d[2][3];
  dVar30 = dVar33 + dVar32 + dVar34 + dVar28;
  dVar29 = (pTVar8->mat).d[0][1];
  dVar1 = (pTVar8->mat).d[1][1];
  dVar19 = dVar18 * dVar29;
  dVar20 = dVar18 * dVar1;
  dVar2 = (pTVar8->mat).d[0][0];
  dVar3 = (pTVar8->mat).d[1][0];
  dVar14 = dVar13 * dVar2;
  dVar17 = dVar13 * dVar3;
  dVar4 = (pTVar8->mat).d[0][2];
  dVar5 = (pTVar8->mat).d[1][2];
  dVar23 = dVar22 * dVar4;
  dVar24 = dVar22 * dVar5;
  dVar6 = (pTVar8->mat).d[0][3];
  dVar7 = (pTVar8->mat).d[1][3];
  dVar18 = (pTVar8->mat).d[3][2] * dVar22 +
           (pTVar8->mat).d[3][0] * dVar13 + (pTVar8->mat).d[3][1] * dVar18 + (pTVar8->mat).d[3][3];
  (__return_storage_ptr__->pfError).x =
       (dVar27 * ABS(dVar4) + dVar10 * ABS(dVar2) + dVar31 * ABS(dVar29)) * 1.0000000000000004 +
       (ABS(dVar6) + ABS(dVar23) + ABS(dVar19) + ABS(dVar14)) * 3.3306690738754706e-16;
  (__return_storage_ptr__->pfError).y =
       (dVar27 * ABS(dVar5) + dVar10 * ABS(dVar3) + dVar31 * ABS(dVar1)) * 1.0000000000000004 +
       (ABS(dVar7) + ABS(dVar24) + ABS(dVar20) + ABS(dVar17)) * 3.3306690738754706e-16;
  (__return_storage_ptr__->pfError).z =
       (ABS(dVar26) * dVar27 + ABS(dVar21) * dVar10 + ABS(dVar25) * dVar31) * 1.0000000000000004 +
       (ABS(dVar28) + ABS(dVar34) + ABS(dVar32) + ABS(dVar33)) * 3.3306690738754706e-16;
  uVar12 = -(uint)(dVar18 == 1.0) & 1;
  dVar13 = 1.0 / dVar18;
  dVar21 = dVar30 * dVar13;
  if ((dVar18 == 1.0) && (!NAN(dVar18))) {
    dVar21 = dVar30;
  }
  dVar6 = dVar6 + dVar23 + dVar14 + dVar19;
  dVar7 = dVar7 + dVar24 + dVar17 + dVar20;
  auVar15._0_8_ = CONCAT44((int)(uVar12 << 0x1f) >> 0x1f,(int)(uVar12 << 0x1f) >> 0x1f);
  auVar15._8_4_ = (int)(uVar12 << 0x1f) >> 0x1f;
  auVar15._12_4_ = (int)(uVar12 << 0x1f) >> 0x1f;
  uVar11 = (ulong)dVar7 & auVar15._8_8_;
  auVar16._0_8_ = ~auVar15._0_8_ & (ulong)(dVar13 * dVar6);
  auVar16._8_8_ = ~auVar15._8_8_ & (ulong)(dVar13 * dVar7);
  auVar9._8_4_ = (int)uVar11;
  auVar9._0_8_ = (ulong)dVar6 & auVar15._0_8_;
  auVar9._12_4_ = (int)(uVar11 >> 0x20);
  (__return_storage_ptr__->p).x = (double)SUB168(auVar16 | auVar9,0);
  (__return_storage_ptr__->p).y = (double)SUB168(auVar16 | auVar9,8);
  (__return_storage_ptr__->p).z = dVar21;
  (*(this->super_Shape)._vptr_Shape[4])(this);
  *pdf = 1.0 / extraout_XMM0_Qa;
  return __return_storage_ptr__;
}

Assistant:

Interaction Sphere::sample(const Point2f& u, Real* pdf) const {
    Point3f pObj = Point3f(0, 0, 0) + radius * uniformSampleSphere(u);
    Interaction it;

    it.n = normalize((*localToWorld)(Normal3f(pObj.x, pObj.y, pObj.z)));
    if (reverseNormals) it.n *= -1;

    // Reproject _pObj_ to sphere surface and compute _pObjError_
    pObj *= radius / distance(pObj, Point3f(0, 0, 0));
    Vector3f pObjError = gamma(5) * abs((Vector3f)pObj);
    it.p = (*localToWorld)(pObj, pObjError, &it.pfError);
    *pdf = 1 / surfaceArea();

    return it;
}